

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  size_t sVar1;
  size_t sVar2;
  string *psVar3;
  char *pcVar4;
  ulong uVar5;
  iterator *in_RDI;
  bool bVar6;
  size_t len;
  size_t width;
  bool local_3a;
  byte local_39;
  undefined7 in_stack_ffffffffffffffd0;
  char c;
  size_t local_18;
  
  in_RDI->m_suffix = false;
  sVar2 = in_RDI->m_column->m_width;
  sVar1 = indent(in_RDI);
  sVar2 = sVar2 - sVar1;
  in_RDI->m_end = in_RDI->m_pos;
  psVar3 = line_abi_cxx11_((iterator *)0x18ce0a);
  pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)psVar3);
  if (*pcVar4 == '\n') {
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  while( true ) {
    sVar1 = in_RDI->m_end;
    line_abi_cxx11_((iterator *)0x18ce49);
    uVar5 = ::std::__cxx11::string::size();
    bVar6 = false;
    if (sVar1 < uVar5) {
      psVar3 = line_abi_cxx11_((iterator *)0x18ce6e);
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)psVar3);
      bVar6 = *pcVar4 != '\n';
    }
    if (!bVar6) break;
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  if (in_RDI->m_end < in_RDI->m_pos + sVar2) {
    in_RDI->m_len = in_RDI->m_end - in_RDI->m_pos;
  }
  else {
    c = '\0';
    local_18 = sVar2;
    while( true ) {
      local_39 = 0;
      if (local_18 != 0) {
        bVar6 = isBoundary((iterator *)CONCAT17(c,in_stack_ffffffffffffffd0),sVar1);
        local_39 = bVar6 ^ 0xff;
      }
      if ((local_39 & 1) == 0) break;
      local_18 = local_18 - 1;
    }
    while( true ) {
      local_3a = false;
      if (local_18 != 0) {
        psVar3 = line_abi_cxx11_((iterator *)0x18cf3b);
        ::std::__cxx11::string::operator[]((ulong)psVar3);
        local_3a = isWhitespace(c);
      }
      if (local_3a == false) break;
      local_18 = local_18 - 1;
    }
    if (local_18 == 0) {
      in_RDI->m_suffix = true;
      in_RDI->m_len = sVar2 - 1;
    }
    else {
      in_RDI->m_len = local_18;
    }
  }
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}